

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

ItemFlags __thiscall QUrlModel::flags(QUrlModel *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QFlagsStorage<Qt::ItemFlag> arole;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  ItemFlags flags;
  undefined8 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  arole.i = QStandardItemModel::flags(in_RDI);
  bVar2 = QModelIndex::isValid(in_RSI);
  if (bVar2) {
    QFlags<Qt::ItemFlag>::operator&=((QFlags<Qt::ItemFlag> *)&stack0xffffffffffffffd4,-3);
    QFlags<Qt::ItemFlag>::operator&=((QFlags<Qt::ItemFlag> *)&stack0xffffffffffffffd4,-9);
  }
  QModelIndex::data((QModelIndex *)in_stack_ffffffffffffffd8,arole.i);
  bVar3 = ::QVariant::isNull();
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  if ((bVar3 & 1) != 0) {
    QFlags<Qt::ItemFlag>::operator&=((QFlags<Qt::ItemFlag> *)&stack0xffffffffffffffd4,-0x21);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)arole.i;
}

Assistant:

Qt::ItemFlags QUrlModel::flags(const QModelIndex &index) const
{
    Qt::ItemFlags flags = QStandardItemModel::flags(index);
    if (index.isValid()) {
        flags &= ~Qt::ItemIsEditable;
        // ### some future version could support "moving" urls onto a folder
        flags &= ~Qt::ItemIsDropEnabled;
    }

    if (index.data(Qt::DecorationRole).isNull())
        flags &= ~Qt::ItemIsEnabled;

    return flags;
}